

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O3

int duckdb_brotli::InitializeCompoundDictionaryCopy
              (BrotliDecoderStateInternal *s,int address,int length)

{
  uint uVar1;
  BrotliDecoderCompoundDictionary *pBVar2;
  bool bVar3;
  byte bVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  BrotliDecoderCompoundDictionary *addon;
  long lVar9;
  long lVar10;
  int iVar11;
  
  pBVar2 = s->compound_dictionary;
  iVar6 = pBVar2->block_bits;
  if (iVar6 == -1) {
    iVar6 = -1;
    do {
      bVar4 = (char)iVar6 + 9U & 0x1f;
      iVar6 = iVar6 + 1;
    } while (pBVar2->total_size + -1 >> bVar4 != 0);
    pBVar2->block_bits = iVar6;
    if (0 < pBVar2->total_size) {
      lVar10 = 0;
      iVar11 = 0 >> bVar4;
      do {
        lVar9 = (long)(int)lVar10 + -1;
        do {
          lVar10 = lVar9 + 1;
          lVar5 = lVar9 + 2;
          lVar9 = lVar10;
        } while (pBVar2->chunk_offsets[lVar5] < iVar11);
        pBVar2->block_map[iVar11 >> ((byte)iVar6 & 0x1f)] = (uint8_t)lVar10;
        iVar11 = iVar11 + (1 << ((byte)iVar6 & 0x1f));
      } while (iVar11 < pBVar2->total_size);
      iVar6 = pBVar2->block_bits;
    }
  }
  uVar7 = (ulong)pBVar2->block_map[address >> ((byte)iVar6 & 0x1f)] - 1;
  do {
    uVar8 = uVar7 + 1;
    lVar10 = uVar7 + 2;
    uVar7 = uVar8;
  } while (pBVar2->chunk_offsets[lVar10] <= address);
  bVar3 = length + address <= pBVar2->total_size;
  if (bVar3) {
    uVar1 = s->dist_rb_idx;
    s->dist_rb[uVar1 & 3] = s->distance_code;
    s->dist_rb_idx = uVar1 + 1;
    s->meta_block_remaining_len = s->meta_block_remaining_len - length;
    pBVar2->br_index = (int)uVar8;
    pBVar2->br_offset = address - pBVar2->chunk_offsets[uVar8 & 0xffffffff];
    pBVar2->br_length = length;
    pBVar2->br_copied = 0;
  }
  return (uint)bVar3;
}

Assistant:

static BROTLI_BOOL InitializeCompoundDictionaryCopy(BrotliDecoderState *s, int address, int length) {
	BrotliDecoderCompoundDictionary *addon = s->compound_dictionary;
	int index;
	EnsureCoumpoundDictionaryInitialized(s);
	index = addon->block_map[address >> addon->block_bits];
	while (address >= addon->chunk_offsets[index + 1])
		index++;
	if (addon->total_size < address + length)
		return BROTLI_FALSE;
	/* Update the recent distances cache. */
	s->dist_rb[s->dist_rb_idx & 3] = s->distance_code;
	++s->dist_rb_idx;
	s->meta_block_remaining_len -= length;
	addon->br_index = index;
	addon->br_offset = address - addon->chunk_offsets[index];
	addon->br_length = length;
	addon->br_copied = 0;
	return BROTLI_TRUE;
}